

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdtd1D.c
# Opt level: O1

fdtd1D * init_fdtd_1D(fdtd1D *__return_storage_ptr__,float_type domain_size,float_type Sc,
                     float_type smallest_wavelength,border_condition *borders)

{
  float_type *pfVar1;
  size_t __nmemb;
  undefined8 in_XMM0_Qb;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  
  dVar5 = smallest_wavelength / 20.0;
  dVar4 = (dVar5 * Sc) / 299792458.0;
  auVar3._0_8_ = domain_size / dVar5;
  auVar3._8_8_ = in_XMM0_Qb;
  auVar3 = vroundsd_avx(auVar3,auVar3,10);
  __nmemb = vcvttsd2usi_avx512f(auVar3);
  __return_storage_ptr__->dx = dVar5;
  __return_storage_ptr__->dt = dVar4;
  pfVar1 = (float_type *)calloc(__nmemb,8);
  __return_storage_ptr__->ez = pfVar1;
  pfVar1 = (float_type *)calloc(__nmemb,8);
  __return_storage_ptr__->hy = pfVar1;
  pfVar1 = (float_type *)calloc(__nmemb,8);
  __return_storage_ptr__->permittivity_inv = pfVar1;
  pfVar1 = (float_type *)calloc(__nmemb,8);
  __return_storage_ptr__->permeability_inv = pfVar1;
  *(undefined8 *)__return_storage_ptr__->border_condition = *(undefined8 *)borders;
  __return_storage_ptr__->domain_size = domain_size;
  __return_storage_ptr__->sizeX = __nmemb;
  __return_storage_ptr__->Sc = Sc;
  __return_storage_ptr__->num_Jsources = 0;
  auVar2 = ZEXT816(0) << 0x20;
  __return_storage_ptr__->Jsources = (fdtd_source *)auVar2._0_8_;
  __return_storage_ptr__->JsourceLocations = (uintmax_t *)auVar2._8_8_;
  __return_storage_ptr__->num_Msources = 0;
  __return_storage_ptr__->Msources = (fdtd_source *)auVar2._0_8_;
  __return_storage_ptr__->MsourceLocations = (uintmax_t *)auVar2._8_8_;
  __return_storage_ptr__->time = 0.0;
  fprintf(_stderr,"Dt %e Dx %e (%.0f)\n",dVar4,dVar5,auVar3._0_8_);
  return __return_storage_ptr__;
}

Assistant:

struct fdtd1D init_fdtd_1D(float_type domain_size, float_type Sc,
                           float_type smallest_wavelength,
                           enum border_condition borders[num_borders_1D]) {

  float_type dx = smallest_wavelength / float_cst(20.);
  float_type dt = dx * Sc / c_light;
  float_type sizeXf = ceil(domain_size / dx);
  uintmax_t sizeX = (uintmax_t)sizeXf;
  struct fdtd1D fdtd = {
      .dx = dx,
      .dt = dt,
      .ez = calloc(sizeX, sizeof(float_type)),
      .hy = calloc(sizeX, sizeof(float_type)),
      .permittivity_inv = calloc(sizeX, sizeof(float_type)),
      .permeability_inv = calloc(sizeX, sizeof(float_type)),
      .border_condition = {[border_oneside] = borders[border_oneside],
                           [border_otherside] = borders[border_otherside]},
      .domain_size = domain_size,
      .sizeX = sizeX,
      .Sc = Sc,
      .num_Jsources = 0,
      .Jsources = NULL,
      .JsourceLocations = NULL,
      .num_Msources = 0,
      .Msources = NULL,
      .MsourceLocations = NULL,
      .time = 0,
  };
  fprintf(stderr, "Dt %e Dx %e (%.0f)\n", dt, dx, sizeXf);

  return fdtd;
}